

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O2

bool __thiscall MeCab::DecoderFeatureIndex::openTextModel(DecoderFeatureIndex *this,Param *param)

{
  char *begin;
  bool bVar1;
  string modelfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  Param::get<std::__cxx11::string>(&local_38,param,"model");
  FeatureIndex::convert(param,local_38._M_dataplus._M_p,&this->model_buffer_);
  begin = (this->model_buffer_)._M_dataplus._M_p;
  bVar1 = openFromArray(this,begin,begin + (this->model_buffer_)._M_string_length);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool DecoderFeatureIndex::openTextModel(const Param &param) {
  const std::string modelfile = param.get<std::string>("model");
  CHECK_DIE(FeatureIndex::convert(param, modelfile.c_str(), &model_buffer_));
  return openFromArray(model_buffer_.data(),
                       model_buffer_.data() + model_buffer_.size());
}